

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O0

bool __thiscall
sptk::StatisticsAccumulation::GetUnbiasedCovariance
          (StatisticsAccumulation *this,Buffer *buffer,SymmetricMatrix *unbiased_covariance)

{
  bool bVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int j;
  int i;
  double z;
  SymmetricMatrix *in_stack_00000098;
  Buffer *in_stack_000000a0;
  StatisticsAccumulation *in_stack_000000a8;
  double dVar2;
  Row *this_00;
  SymmetricMatrix *in_stack_ffffffffffffff98;
  Row local_48;
  int local_30;
  int local_2c;
  double local_28;
  long local_18;
  bool local_1;
  
  if (((((*(byte *)(in_RDI + 0x12) & 1) == 0) || (*(int *)(in_RDI + 0xc) < 2)) ||
      ((*(byte *)(in_RDI + 0x10) & 1) != 0)) || ((*(int *)(in_RSI + 8) < 2 || (in_RDX == 0)))) {
    local_1 = false;
  }
  else {
    local_18 = in_RSI;
    bVar1 = GetFullCovariance(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
    if (bVar1) {
      local_28 = (double)*(int *)(local_18 + 8) / (double)(*(int *)(local_18 + 8) + -1);
      for (local_2c = 0; local_2c <= *(int *)(in_RDI + 8); local_2c = local_2c + 1) {
        for (local_30 = 0; local_30 <= local_2c; local_30 = local_30 + 1) {
          this_00 = &local_48;
          dVar2 = local_28;
          SymmetricMatrix::operator[](in_stack_ffffffffffffff98,(int)((ulong)this_00 >> 0x20));
          in_stack_ffffffffffffff98 =
               (SymmetricMatrix *)
               SymmetricMatrix::Row::operator[](this_00,(int)((ulong)dVar2 >> 0x20));
          in_stack_ffffffffffffff98->_vptr_SymmetricMatrix =
               (_func_int **)(dVar2 * (double)in_stack_ffffffffffffff98->_vptr_SymmetricMatrix);
          SymmetricMatrix::Row::~Row(&local_48);
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool StatisticsAccumulation::GetUnbiasedCovariance(
    const StatisticsAccumulation::Buffer& buffer,
    SymmetricMatrix* unbiased_covariance) const {
  if (!is_valid_ || num_statistics_order_ < 2 || diagonal_ ||
      buffer.zeroth_order_statistics_ <= 1 || NULL == unbiased_covariance) {
    return false;
  }

  if (!GetFullCovariance(buffer, unbiased_covariance)) {
    return false;
  }

  const double z(static_cast<double>(buffer.zeroth_order_statistics_) /
                 (buffer.zeroth_order_statistics_ - 1));
  for (int i(0); i <= num_order_; ++i) {
    for (int j(0); j <= i; ++j) {
      (*unbiased_covariance)[i][j] *= z;
    }
  }

  return true;
}